

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void fixupL(int n,int *perm_r,GlobalLU_t *Glu)

{
  uint uVar1;
  int iVar2;
  int_t *piVar3;
  uint *puVar4;
  int_t *piVar5;
  long lVar6;
  ulong uVar7;
  int_t iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  if (1 < n) {
    piVar3 = Glu->xlsub;
    uVar1 = Glu->supno[(uint)n];
    if ((int)uVar1 < 0) {
      iVar8 = 0;
    }
    else {
      puVar4 = (uint *)Glu->xsup;
      piVar5 = Glu->lsub;
      uVar7 = (ulong)*puVar4;
      lVar10 = 0;
      lVar9 = 0;
      do {
        lVar12 = (long)(int)uVar7;
        iVar2 = piVar3[lVar12];
        lVar6 = (long)iVar2;
        piVar3[lVar12] = (int)lVar9;
        lVar11 = lVar12 + 1;
        if (iVar2 < piVar3[lVar12 + 1]) {
          lVar9 = (long)(int)lVar9;
          do {
            piVar5[lVar9] = perm_r[piVar5[lVar6]];
            lVar9 = lVar9 + 1;
            lVar6 = lVar6 + 1;
          } while (lVar6 < piVar3[lVar11]);
        }
        iVar8 = (int_t)lVar9;
        lVar6 = lVar10 + 1;
        uVar7 = (ulong)puVar4[lVar6];
        lVar10 = lVar10 + 1;
        if ((int)lVar11 < (int)puVar4[lVar6]) {
          do {
            piVar3[lVar11] = iVar8;
            lVar11 = lVar11 + 1;
            uVar7 = (ulong)(int)puVar4[lVar10];
          } while (lVar11 < (long)uVar7);
        }
      } while (lVar10 != (ulong)uVar1 + 1);
    }
    piVar3[(uint)n] = iVar8;
  }
  return;
}

Assistant:

void
fixupL(const int n, const int *perm_r, GlobalLU_t *Glu)
{
    int nsuper, fsupc, i, k;
    int_t nextl, j, jstrt;
    int   *xsup;
    int_t *lsub, *xlsub;

    if ( n <= 1 ) return;

    xsup   = Glu->xsup;
    lsub   = Glu->lsub;
    xlsub  = Glu->xlsub;
    nextl  = 0;
    nsuper = (Glu->supno)[n];
    
    /* 
     * For each supernode ...
     */
    for (i = 0; i <= nsuper; i++) {
	fsupc = xsup[i];
	jstrt = xlsub[fsupc];
	xlsub[fsupc] = nextl;
	for (j = jstrt; j < xlsub[fsupc+1]; j++) {
	    lsub[nextl] = perm_r[lsub[j]]; /* Now indexed into P*A */
	    nextl++;
  	}
	for (k = fsupc+1; k < xsup[i+1]; k++) 
	    	xlsub[k] = nextl;	/* Other columns in supernode i */

    }

    xlsub[n] = nextl;
}